

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tri_normdev_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_normdev)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  double dVar7;
  REF_DBL normdev;
  REF_INT nodes [27];
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  *min_normdev = 2.0;
  if (((node < 0) || (pRVar1 = ref_cell->ref_adj, pRVar1->nnode <= node)) ||
     (lVar6 = (long)pRVar1->first[(uint)node], lVar6 == -1)) {
    *min_normdev = -2.0;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xd3,
           "ref_smooth_tri_normdev_around","no triangle found, can not compute normdev");
    uVar3 = 1;
  }
  else {
    uVar3 = ref_cell_nodes(ref_cell,pRVar1->item[lVar6].ref,local_a8);
    if (uVar3 == 0) {
      do {
        uVar3 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_b0);
        if (uVar3 != 0) {
          if (uVar3 == 4) {
            *min_normdev = -1.5;
            return 0;
          }
          pcVar5 = "ref_geom_tri_norm_deviation";
          uVar4 = 0xcd;
          goto LAB_001f2066;
        }
        dVar7 = *min_normdev;
        if (local_b0 <= *min_normdev) {
          dVar7 = local_b0;
        }
        *min_normdev = dVar7;
        pRVar2 = ref_cell->ref_adj->item;
        lVar6 = (long)pRVar2[(int)lVar6].next;
        if (lVar6 == -1) {
          return 0;
        }
        uVar3 = ref_cell_nodes(ref_cell,pRVar2[lVar6].ref,local_a8);
      } while (uVar3 == 0);
    }
    pcVar5 = "nodes";
    uVar4 = 0xc6;
LAB_001f2066:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar4,
           "ref_smooth_tri_normdev_around",(ulong)uVar3,pcVar5);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_normdev_around(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *min_normdev) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL normdev;
  REF_STATUS status;

  *min_normdev = 2.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    none_found = REF_FALSE;
    status = ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev);
    if (REF_DIV_ZERO == status) {
      *min_normdev = -1.5;
      return REF_SUCCESS;
    }
    RSS(status, "ref_geom_tri_norm_deviation");
    *min_normdev = MIN(*min_normdev, normdev);
  }

  if (none_found) {
    *min_normdev = -2.0;
    THROW("no triangle found, can not compute normdev");
  }

  return REF_SUCCESS;
}